

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O0

apx_socketServerConnection_t * apx_socketServerConnection_new(msocket_t *socket_object)

{
  apx_error_t aVar1;
  apx_socketServerConnection_t *paStack_20;
  apx_error_t result;
  apx_socketServerConnection_t *self;
  msocket_t *socket_object_local;
  
  if (socket_object == (msocket_t *)0x0) {
    socket_object_local = (msocket_t *)0x0;
  }
  else {
    paStack_20 = (apx_socketServerConnection_t *)malloc(0x600);
    if ((paStack_20 != (apx_socketServerConnection_t *)0x0) &&
       (aVar1 = apx_socketServerConnection_create(paStack_20,socket_object), aVar1 != 0)) {
      free(paStack_20);
      paStack_20 = (apx_socketServerConnection_t *)0x0;
    }
    socket_object_local = (msocket_t *)paStack_20;
  }
  return (apx_socketServerConnection_t *)socket_object_local;
}

Assistant:

apx_socketServerConnection_t *apx_socketServerConnection_new(SOCKET_TYPE *socket_object)
{
   if (socket_object != NULL)
   {
      apx_socketServerConnection_t *self = (apx_socketServerConnection_t*) malloc(sizeof(apx_socketServerConnection_t));
      if (self != NULL)
      {
         apx_error_t result = apx_socketServerConnection_create(self, socket_object);
         if (result != APX_NO_ERROR)
         {
            free(self);
            self = (apx_socketServerConnection_t*)NULL;
         }
      }
      return self;
   }
   return (apx_socketServerConnection_t*)NULL;
}